

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool SetPropertyCommand::HandleSourceFileDirectoryScopeValidation
               (cmExecutionStatus *status,bool source_file_directory_option_enabled,
               bool source_file_target_option_enabled,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_directories,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_target_directories)

{
  undefined7 in_register_00000031;
  string errors;
  allocator<char> local_29;
  string local_28 [32];
  
  if (((int)CONCAT71(in_register_00000031,source_file_directory_option_enabled) == 0) ||
     ((source_file_directories->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (source_file_directories->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    if (!source_file_target_option_enabled) {
      return true;
    }
    if ((source_file_target_directories->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (source_file_target_directories->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_28,
               "called with incorrect number of arguments no value provided to the TARGET_DIRECTORY option"
               ,&local_29);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_28,
               "called with incorrect number of arguments no value provided to the DIRECTORY option"
               ,&local_29);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string(local_28);
  return false;
}

Assistant:

bool HandleSourceFileDirectoryScopeValidation(
  cmExecutionStatus& status, bool source_file_directory_option_enabled,
  bool source_file_target_option_enabled,
  std::vector<std::string>& source_file_directories,
  std::vector<std::string>& source_file_target_directories)
{
  // Validate source file directory scopes.
  if (source_file_directory_option_enabled &&
      source_file_directories.empty()) {
    std::string errors = "called with incorrect number of arguments "
                         "no value provided to the DIRECTORY option";
    status.SetError(errors);
    return false;
  }
  if (source_file_target_option_enabled &&
      source_file_target_directories.empty()) {
    std::string errors = "called with incorrect number of arguments "
                         "no value provided to the TARGET_DIRECTORY option";
    status.SetError(errors);
    return false;
  }
  return true;
}